

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void get_range<double,int>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,int *Xc_ind,
               int *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  long lVar1;
  ulong *puVar2;
  ulong *puVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  int *piVar10;
  bool bVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  lVar9 = (long)Xc_indptr[col_num];
  lVar13 = (long)Xc_indptr[col_num + 1];
  bVar11 = true;
  if (Xc_indptr[col_num + 1] == Xc_indptr[col_num]) goto LAB_001704f8;
  iVar5 = Xc_ind[lVar9];
  if ((int)ix_arr[end] < iVar5) goto LAB_001704f8;
  lVar1 = lVar13 + -1;
  iVar6 = Xc_ind[lVar1];
  if (iVar6 < (int)ix_arr[st]) goto LAB_001704f8;
  puVar3 = ix_arr + end;
  puVar15 = ix_arr + st;
  uVar12 = (end - st) + 1;
  if (((iVar6 < (int)ix_arr[end]) || ((ulong)(lVar13 - lVar9) < uVar12)) ||
     ((int)ix_arr[st] < iVar5)) {
    *xmin = 0.0;
    *xmax = 0.0;
    dVar22 = 0.0;
    dVar20 = 0.0;
  }
  else {
    dVar20 = -INFINITY;
    dVar22 = INFINITY;
  }
  puVar2 = puVar3 + 1;
  uVar14 = (long)puVar2 - (long)puVar15 >> 3;
  if (missing_action == Fail) {
    while (0 < (long)uVar14) {
      uVar17 = uVar14 >> 1;
      uVar16 = ~uVar17 + uVar14;
      uVar14 = uVar17;
      if (puVar15[uVar17] < (ulong)(long)iVar5) {
        puVar15 = puVar15 + uVar17 + 1;
        uVar14 = uVar16;
      }
    }
    if (puVar15 == puVar2) goto LAB_0017048d;
    lVar7 = lVar1 * 4 + 4;
    uVar14 = 0;
    while (uVar16 = *puVar15, uVar16 <= (ulong)(long)iVar6) {
      piVar10 = Xc_ind + lVar9;
      iVar5 = *piVar10;
      if (iVar5 == (int)uVar16) {
        uVar14 = uVar14 + 1;
        dVar4 = Xc[lVar9];
        dVar21 = dVar4;
        if (dVar22 <= dVar4) {
          dVar21 = dVar22;
        }
        *xmin = dVar21;
        if (dVar4 <= dVar20) {
          dVar4 = dVar20;
        }
        dVar20 = dVar4;
        *xmax = dVar20;
        dVar22 = dVar21;
        if ((puVar15 == puVar3) || (lVar9 == lVar1)) break;
        puVar15 = puVar15 + 1;
        uVar16 = (long)Xc_ind + (lVar7 - (long)piVar10) >> 2;
        if (0 < (long)uVar16) {
          do {
            uVar17 = uVar16 >> 1;
            uVar18 = ~uVar17 + uVar16;
            uVar16 = uVar17;
            if ((ulong)(long)piVar10[uVar17] < *puVar15) {
              piVar10 = piVar10 + uVar17 + 1;
              uVar16 = uVar18;
            }
          } while (0 < (long)uVar16);
        }
        lVar9 = (long)piVar10 - (long)Xc_ind >> 2;
      }
      else if ((int)uVar16 < iVar5) {
        puVar15 = puVar15 + 1;
        uVar16 = (long)puVar2 - (long)puVar15 >> 3;
        while (0 < (long)uVar16) {
          uVar17 = uVar16 >> 1;
          uVar18 = ~uVar17 + uVar16;
          uVar16 = uVar17;
          if (puVar15[uVar17] < (ulong)(long)iVar5) {
            puVar15 = puVar15 + uVar17 + 1;
            uVar16 = uVar18;
          }
        }
      }
      else {
        piVar8 = piVar10 + 1;
        uVar17 = (long)Xc_ind + (lVar7 - (long)(piVar10 + 1)) >> 2;
        while (0 < (long)uVar17) {
          uVar18 = uVar17 >> 1;
          uVar19 = ~uVar18 + uVar17;
          uVar17 = uVar18;
          if ((ulong)(long)piVar8[uVar18] < uVar16) {
            piVar8 = piVar8 + uVar18 + 1;
            uVar17 = uVar19;
          }
        }
        lVar9 = (long)piVar8 - (long)Xc_ind >> 2;
      }
      if ((puVar15 == puVar2) || (lVar9 == lVar13)) break;
    }
  }
  else {
    while (0 < (long)uVar14) {
      uVar16 = uVar14 >> 1;
      uVar17 = ~uVar16 + uVar14;
      uVar14 = uVar16;
      if (puVar15[uVar16] < (ulong)(long)iVar5) {
        puVar15 = puVar15 + uVar16 + 1;
        uVar14 = uVar17;
      }
    }
    if (puVar15 == puVar2) {
LAB_0017048d:
      uVar14 = 0;
    }
    else {
      lVar7 = lVar1 * 4 + 4;
      uVar14 = 0;
      while (uVar16 = *puVar15, uVar16 <= (ulong)(long)iVar6) {
        piVar10 = Xc_ind + lVar9;
        iVar5 = *piVar10;
        if (iVar5 == (int)uVar16) {
          uVar14 = uVar14 + 1;
          dVar4 = Xc[lVar9];
          dVar21 = dVar4;
          if (dVar22 <= dVar4) {
            dVar21 = dVar22;
          }
          dVar22 = (double)(~-(ulong)NAN(dVar22) & (ulong)dVar21 |
                           -(ulong)NAN(dVar22) & (ulong)dVar4);
          *xmin = dVar22;
          dVar21 = dVar4;
          if (dVar4 <= dVar20) {
            dVar21 = dVar20;
          }
          dVar20 = (double)(~-(ulong)NAN(dVar20) & (ulong)dVar21 |
                           -(ulong)NAN(dVar20) & (ulong)dVar4);
          *xmax = dVar20;
          if ((puVar15 == puVar3) || (lVar9 == lVar1)) break;
          puVar15 = puVar15 + 1;
          uVar16 = (long)Xc_ind + (lVar7 - (long)piVar10) >> 2;
          if (0 < (long)uVar16) {
            do {
              uVar17 = uVar16 >> 1;
              uVar18 = ~uVar17 + uVar16;
              uVar16 = uVar17;
              if ((ulong)(long)piVar10[uVar17] < *puVar15) {
                piVar10 = piVar10 + uVar17 + 1;
                uVar16 = uVar18;
              }
            } while (0 < (long)uVar16);
          }
          lVar9 = (long)piVar10 - (long)Xc_ind >> 2;
        }
        else if ((int)uVar16 < iVar5) {
          puVar15 = puVar15 + 1;
          uVar16 = (long)puVar2 - (long)puVar15 >> 3;
          while (0 < (long)uVar16) {
            uVar17 = uVar16 >> 1;
            uVar18 = ~uVar17 + uVar16;
            uVar16 = uVar17;
            if (puVar15[uVar17] < (ulong)(long)iVar5) {
              puVar15 = puVar15 + uVar17 + 1;
              uVar16 = uVar18;
            }
          }
        }
        else {
          piVar8 = piVar10 + 1;
          uVar17 = (long)Xc_ind + (lVar7 - (long)(piVar10 + 1)) >> 2;
          while (0 < (long)uVar17) {
            uVar18 = uVar17 >> 1;
            uVar19 = ~uVar18 + uVar17;
            uVar17 = uVar18;
            if ((ulong)(long)piVar8[uVar18] < uVar16) {
              piVar8 = piVar8 + uVar18 + 1;
              uVar17 = uVar19;
            }
          }
          lVar9 = (long)piVar8 - (long)Xc_ind >> 2;
        }
        if ((puVar15 == puVar2) || (lVar9 == lVar13)) break;
      }
    }
  }
  if (uVar14 < uVar12) {
    if (0.0 <= dVar22) {
      dVar22 = 0.0;
    }
    *xmin = dVar22;
    if (dVar20 <= 0.0) {
      dVar20 = 0.0;
    }
    *xmax = dVar20;
  }
  if (((dVar22 != dVar20) || (NAN(dVar22) || NAN(dVar20))) &&
     (dVar20 != -INFINITY || dVar22 != INFINITY)) {
    bVar11 = NAN(dVar20);
  }
LAB_001704f8:
  *unsplittable = bVar11;
  return;
}

Assistant:

void get_range(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    /* ix_arr must already be sorted beforehand */
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1];
    size_t nnz_col = end_col - st_col;
    end_col--;
    size_t curr_pos = st_col;

    if (!nnz_col || 
        Xc_ind[st_col]         >   (sparse_ix)ix_arr[end] || 
        (sparse_ix)ix_arr[st]  >   Xc_ind[end_col]
        )
    {
        unsplittable = true;
        return;
    }

    if (nnz_col < end - st + 1 ||
        Xc_ind[st_col]  > (sparse_ix)ix_arr[st] ||
        Xc_ind[end_col] < (sparse_ix)ix_arr[end]
        )
    {
        xmin = 0;
        xmax = 0;
    }

    size_t ind_end_col = Xc_ind[end_col];
    size_t nmatches = 0;

    if (missing_action == Fail)
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = (Xc[curr_pos] < xmin)? Xc[curr_pos] : xmin;
                xmax = (Xc[curr_pos] > xmax)? Xc[curr_pos] : xmax;
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    else /* can have NAs */
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = std::fmin(xmin, Xc[curr_pos]);
                xmax = std::fmax(xmax, Xc[curr_pos]);
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

    }

    if (nmatches < (end - st + 1))
    {
        xmin = std::fmin(xmin, 0);
        xmax = std::fmax(xmax, 0);
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}